

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QRect __thiscall
QAbstractItemViewPrivate::intersectedRect
          (QAbstractItemViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  int iVar1;
  QRect *pQVar2;
  QModelIndex *in_RCX;
  QAbstractItemViewPrivate *in_RDI;
  QModelIndex *in_R8;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  QRect QVar4;
  int c;
  int r;
  QAbstractItemView *q;
  QRect updateRect;
  QModelIndex parentIdx;
  QRect *in_stack_ffffffffffffff38;
  QRect *in_stack_ffffffffffffff40;
  QRect *this_00;
  undefined4 in_stack_ffffffffffffff50;
  int iVar5;
  undefined4 in_stack_ffffffffffffff54;
  int local_a0;
  int local_9c;
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QRect *)q_func(in_RDI);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect(in_stack_ffffffffffffff40);
  local_9c = QModelIndex::row(in_RCX);
  while( true ) {
    iVar5 = local_9c;
    iVar1 = QModelIndex::row(in_R8);
    if (iVar1 < iVar5) break;
    local_a0 = QModelIndex::column(in_RCX);
    while( true ) {
      iVar5 = local_a0;
      iVar1 = QModelIndex::column(in_R8);
      if (iVar1 < iVar5) break;
      this_00 = pQVar2;
      (**(code **)(*(long *)in_RDI->model + 0x60))
                (local_68,in_RDI->model,local_9c,local_a0,&local_30);
      auVar3 = (**(code **)(*(long *)this_00 + 0x1e0))(this_00,local_68);
      local_50 = auVar3;
      QRect::operator|=(this_00,in_stack_ffffffffffffff40);
      local_a0 = local_a0 + 1;
    }
    local_9c = local_9c + 1;
  }
  QVar4 = QRect::intersected(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAbstractItemViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    Q_Q(const QAbstractItemView);

    const auto parentIdx = topLeft.parent();
    QRect updateRect;
    for (int r = topLeft.row(); r <= bottomRight.row(); ++r) {
        for (int c = topLeft.column(); c <= bottomRight.column(); ++c)
            updateRect |= q->visualRect(model->index(r, c, parentIdx));
    }
    return rect.intersected(updateRect);
}